

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::FindMSBCase::compare(FindMSBCase *this,void **inputs,void **outputs)

{
  DataType dataType;
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ostringstream *this_00;
  long lVar14;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize(dataType);
  bVar6 = iVar4 < 1;
  if (0 < iVar4) {
    uVar7 = dataType - TYPE_INT;
    uVar8 = (2 << ((&DAT_00987a80)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    lVar14 = 0;
    do {
      uVar9 = *(uint *)((long)*inputs + lVar14 * 4);
      if (uVar7 < 4) {
        uVar11 = uVar9 & uVar8;
        uVar11 = (uVar11 & 1 << ((&DAT_00987a80)[(ulong)PVar1 * 4] - 1 & 0x1f)) * -2 | uVar11;
        if ((int)uVar11 < 1) {
          iVar12 = -1;
          if ((int)uVar11 < 0) {
            uVar11 = uVar11 ^ 0xffffffff;
            if (uVar11 != 0) goto LAB_00482b5a;
            goto LAB_00482b72;
          }
        }
        else {
          iVar12 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
        }
      }
      else {
        uVar11 = uVar9 & uVar8;
        if (uVar11 == 0) {
LAB_00482b72:
          uVar10 = 0x20;
        }
        else {
LAB_00482b5a:
          uVar10 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          uVar10 = uVar10 ^ 0x1f;
        }
        iVar12 = 0x1f - uVar10;
      }
      if (uVar7 < 4) {
        if ((int)uVar9 < 1) {
          iVar13 = -1;
          if ((int)uVar9 < 0) {
            uVar9 = uVar9 ^ 0xffffffff;
            if (uVar9 != 0) goto LAB_00482b96;
            goto LAB_00482bae;
          }
        }
        else {
          iVar13 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
        }
      }
      else {
        if (uVar9 == 0) {
LAB_00482bae:
          uVar11 = 0x20;
        }
        else {
LAB_00482b96:
          uVar11 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar11 = uVar11 ^ 0x1f;
        }
        iVar13 = 0x1f - uVar11;
      }
      iVar2 = *(int *)((long)*outputs + lVar14 * 4);
      if ((iVar2 < iVar12) || (iVar13 < iVar2)) {
        this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)lVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] in range [",0xc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        return bVar6;
      }
      lVar14 = lVar14 + 1;
      bVar6 = iVar4 <= (int)lVar14;
    } while (iVar4 != (int)lVar14);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const deInt32*)outputs[0])[compNdx];
			const int		minRef	= isSigned ? findMSB(toPrecision(deInt32(value), integerLength))	: findMSB(toPrecision(value, integerLength));
			const int		maxRef	= isSigned ? findMSB(deInt32(value))								: findMSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}